

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool __thiscall
GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature
          (GenericTransactionSignatureChecker<CMutableTransaction> *this,
          Span<const_unsigned_char> sig,Span<const_unsigned_char> pubkey_in,SigVersion sigversion,
          ScriptExecutionData *execdata,ScriptError *serror)

{
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ScriptExecutionData *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  uint8_t hashtype;
  uint256 sighash;
  XOnlyPubKey pubkey;
  Span<const_unsigned_char> *in_stack_ffffffffffffff38;
  ScriptError *ret;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined4 uVar5;
  SigVersion sigversion_00;
  undefined2 in_stack_ffffffffffffff60;
  undefined1 uVar6;
  uchar uVar7;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = SUB84(in_RDI,0);
  sigversion_00 = (SigVersion)((ulong)in_RDI >> 0x20);
  uVar6 = in_R9D == 2 || in_R9D == 3;
  if (in_R9D != 2 && in_R9D != 3) {
    __assert_fail("sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x68b,
                  "virtual bool GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature(Span<const unsigned char>, Span<const unsigned char>, SigVersion, ScriptExecutionData &, ScriptError *) const [T = CMutableTransaction]"
                 );
  }
  sVar2 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff38);
  if (sVar2 != 0x20) {
    __assert_fail("pubkey_in.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x68d,
                  "virtual bool GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature(Span<const unsigned char>, Span<const unsigned char>, SigVersion, ScriptExecutionData &, ScriptError *) const [T = CMutableTransaction]"
                 );
  }
  sVar2 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff38);
  if ((sVar2 == 0x40) ||
     (sVar2 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff38), sVar2 == 0x41)) {
    std::span<const_unsigned_char,_18446744073709551615UL>::span<Span<const_unsigned_char>_&>
              (in_stack_ffffffffffffff48,
               (Span<const_unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    bytes._M_ptr._7_1_ = in_stack_ffffffffffffff57;
    bytes._M_ptr._0_7_ = in_stack_ffffffffffffff50;
    bytes._M_extent._M_extent_value._0_4_ = uVar5;
    bytes._M_extent._M_extent_value._4_4_ = sigversion_00;
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_ffffffffffffff38,bytes);
    uVar7 = '\0';
    sVar2 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff38);
    if (sVar2 == 0x41) {
      puVar3 = SpanPopBack<unsigned_char_const>
                         ((Span<const_unsigned_char> *)in_stack_ffffffffffffff48);
      uVar7 = *puVar3;
      if (uVar7 == '\0') {
        bVar1 = anon_unknown.dwarf_4a160d::set_error
                          ((ScriptError *)in_stack_ffffffffffffff38,SCRIPT_ERR_OK);
        goto LAB_003f4973;
      }
    }
    uint256::uint256((uint256 *)in_stack_ffffffffffffff38);
    if (*(long *)(CONCAT44(sigversion_00,uVar5) + 0x20) == 0) {
      bVar1 = HandleMissingData((MissingDataBehavior)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    }
    else {
      ret = *(ScriptError **)(CONCAT44(sigversion_00,uVar5) + 0x20);
      bVar1 = SignatureHashSchnorr<CMutableTransaction>
                        ((uint256 *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                         in_RDI,(CMutableTransaction *)
                                CONCAT44(in_R9D,CONCAT13(uVar7,CONCAT12(uVar6,
                                                  in_stack_ffffffffffffff60))),
                         (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x18),sigversion_00,
                         (PrecomputedTransactionData *)
                         pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_,
                         pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._8_4_);
      if (bVar1) {
        uVar4 = (**(code **)(*(long *)CONCAT44(sigversion_00,uVar5) + 0x38))
                          ((long *)CONCAT44(sigversion_00,uVar5),in_RSI,in_RDX,local_28,local_48);
        if ((uVar4 & 1) == 0) {
          bVar1 = anon_unknown.dwarf_4a160d::set_error(ret,SCRIPT_ERR_OK);
        }
        else {
          bVar1 = true;
        }
      }
      else {
        bVar1 = anon_unknown.dwarf_4a160d::set_error(ret,SCRIPT_ERR_OK);
      }
    }
  }
  else {
    bVar1 = anon_unknown.dwarf_4a160d::set_error
                      ((ScriptError *)in_stack_ffffffffffffff38,SCRIPT_ERR_OK);
  }
LAB_003f4973:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckSchnorrSignature(Span<const unsigned char> sig, Span<const unsigned char> pubkey_in, SigVersion sigversion, ScriptExecutionData& execdata, ScriptError* serror) const
{
    assert(sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT);
    // Schnorr signatures have 32-byte public keys. The caller is responsible for enforcing this.
    assert(pubkey_in.size() == 32);
    // Note that in Tapscript evaluation, empty signatures are treated specially (invalid signature that does not
    // abort script execution). This is implemented in EvalChecksigTapscript, which won't invoke
    // CheckSchnorrSignature in that case. In other contexts, they are invalid like every other signature with
    // size different from 64 or 65.
    if (sig.size() != 64 && sig.size() != 65) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_SIZE);

    XOnlyPubKey pubkey{pubkey_in};

    uint8_t hashtype = SIGHASH_DEFAULT;
    if (sig.size() == 65) {
        hashtype = SpanPopBack(sig);
        if (hashtype == SIGHASH_DEFAULT) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_HASHTYPE);
    }
    uint256 sighash;
    if (!this->txdata) return HandleMissingData(m_mdb);
    if (!SignatureHashSchnorr(sighash, execdata, *txTo, nIn, hashtype, sigversion, *this->txdata, m_mdb)) {
        return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_HASHTYPE);
    }
    if (!VerifySchnorrSignature(sig, pubkey, sighash)) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG);
    return true;
}